

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::GeneratedMessageReflection::HasBit
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32 has_bit_index;
  CppType CVar2;
  LogMessage *pLVar3;
  uint32 *has_bit_set;
  Message **ppMVar4;
  uint *puVar5;
  bool *pbVar6;
  double *pdVar7;
  float *pfVar8;
  ArenaStringPtr *pAVar9;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (*(char *)(*(long *)(field + 0x80) + 0x6f) == '\x01') {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x7b3);
    pLVar3 = LogMessage::operator<<(&local_58,"CHECK failed: !field->options().weak(): ");
    LogFinisher::operator=(&local_59,pLVar3);
    LogMessage::~LogMessage(&local_58);
  }
  if ((this->schema_).has_bits_offset_ != -1) {
    has_bit_set = GetHasBits(this,message);
    has_bit_index = ReflectionSchema::HasBitIndex(&this->schema_,field);
    bVar1 = anon_unknown_0::IsIndexInHasBitSet(has_bit_set,has_bit_index);
    return bVar1;
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 == CPPTYPE_MESSAGE) {
    if ((this->schema_).default_instance_ == message) {
      return false;
    }
    ppMVar4 = GetRaw<google::protobuf::Message_const*>(this,message,field);
    goto LAB_00319df5;
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  switch(CVar2) {
  case CPPTYPE_INT32:
  case CPPTYPE_ENUM:
    puVar5 = (uint *)GetRaw<int>(this,message,field);
    break;
  case CPPTYPE_INT64:
    ppMVar4 = (Message **)GetRaw<long>(this,message,field);
    goto LAB_00319df5;
  case CPPTYPE_UINT32:
    puVar5 = GetRaw<unsigned_int>(this,message,field);
    break;
  case CPPTYPE_UINT64:
    ppMVar4 = (Message **)GetRaw<unsigned_long>(this,message,field);
LAB_00319df5:
    bVar1 = *ppMVar4 == (Message *)0x0;
    goto LAB_00319ecc;
  case CPPTYPE_DOUBLE:
    pdVar7 = GetRaw<double>(this,message,field);
    bVar1 = *pdVar7 != 0.0;
    goto LAB_00319eb1;
  case CPPTYPE_FLOAT:
    pfVar8 = GetRaw<float>(this,message,field);
    bVar1 = *pfVar8 != 0.0;
LAB_00319eb1:
    return (bool)(-bVar1 & 1);
  case CPPTYPE_BOOL:
    pbVar6 = GetRaw<bool>(this,message,field);
    return *pbVar6;
  case CPPTYPE_STRING:
    pAVar9 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,field);
    bVar1 = pAVar9->ptr_->_M_string_length == 0;
    goto LAB_00319ecc;
  default:
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x7e4);
    pLVar3 = LogMessage::operator<<(&local_58,"Reached impossible case in HasBit().");
    LogFinisher::operator=(&local_59,pLVar3);
    LogMessage::~LogMessage(&local_58);
    return false;
  }
  bVar1 = *puVar5 == 0;
LAB_00319ecc:
  return !bVar1;
}

Assistant:

inline bool GeneratedMessageReflection::HasBit(
    const Message& message, const FieldDescriptor* field) const {
  GOOGLE_DCHECK(!field->options().weak());
  if (schema_.HasHasbits()) {
    return IsIndexInHasBitSet(GetHasBits(message), schema_.HasBitIndex(field));
  }

  // proto3: no has-bits. All fields present except messages, which are
  // present only if their message-field pointer is non-NULL.
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    return !schema_.IsDefaultInstance(message) &&
        GetRaw<const Message*>(message, field) != NULL;
  } else {
    // Non-message field (and non-oneof, since that was handled in HasField()
    // before calling us), and singular (again, checked in HasField). So, this
    // field must be a scalar.

    // Scalar primitive (numeric or string/bytes) fields are present if
    // their value is non-zero (numeric) or non-empty (string/bytes).  N.B.:
    // we must use this definition here, rather than the "scalar fields
    // always present" in the proto3 docs, because MergeFrom() semantics
    // require presence as "present on wire", and reflection-based merge
    // (which uses HasField()) needs to be consistent with this.
    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default: {
            return GetField<ArenaStringPtr>(message, field).Get().size() > 0;
          }
        }
        return false;
      case FieldDescriptor::CPPTYPE_BOOL:
        return GetRaw<bool>(message, field) != false;
      case FieldDescriptor::CPPTYPE_INT32:
        return GetRaw<int32>(message, field) != 0;
      case FieldDescriptor::CPPTYPE_INT64:
        return GetRaw<int64>(message, field) != 0;
      case FieldDescriptor::CPPTYPE_UINT32:
        return GetRaw<uint32>(message, field) != 0;
      case FieldDescriptor::CPPTYPE_UINT64:
        return GetRaw<uint64>(message, field) != 0;
      case FieldDescriptor::CPPTYPE_FLOAT:
        return GetRaw<float>(message, field) != 0.0;
      case FieldDescriptor::CPPTYPE_DOUBLE:
        return GetRaw<double>(message, field) != 0.0;
      case FieldDescriptor::CPPTYPE_ENUM:
        return GetRaw<int>(message, field) != 0;
      case FieldDescriptor::CPPTYPE_MESSAGE:
        // handled above; avoid warning
        break;
    }
    GOOGLE_LOG(FATAL) << "Reached impossible case in HasBit().";
    return false;
  }
}